

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DescriptorSet.cpp
# Opt level: O0

void __thiscall
myvk::DescriptorSet::UpdateStorageImage
          (DescriptorSet *this,Ptr<ImageView> *image_view,uint32_t binding,uint32_t array_element)

{
  PFN_vkUpdateDescriptorSets p_Var1;
  element_type *this_00;
  element_type *this_01;
  VkDevice pVVar2;
  uint32_t in_ECX;
  uint32_t in_EDX;
  long *in_RDI;
  VkWriteDescriptorSet write;
  VkDescriptorImageInfo info;
  VkWriteDescriptorSet local_70;
  VkDescriptorImageInfo local_30;
  uint32_t local_18;
  uint32_t local_14;
  
  local_18 = in_ECX;
  local_14 = in_EDX;
  memset(&local_30,0,0x18);
  this_00 = std::__shared_ptr_access<myvk::ImageView,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
            operator->((__shared_ptr_access<myvk::ImageView,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                        *)0x2e5e74);
  local_30.imageView = ImageView::GetHandle(this_00);
  local_30.imageLayout = VK_IMAGE_LAYOUT_GENERAL;
  memset(&local_70,0,0x40);
  p_Var1 = vkUpdateDescriptorSets;
  local_70.sType = VK_STRUCTURE_TYPE_WRITE_DESCRIPTOR_SET;
  local_70.dstSet = (VkDescriptorSet)in_RDI[7];
  local_70.dstBinding = local_14;
  local_70.dstArrayElement = local_18;
  local_70.descriptorType = VK_DESCRIPTOR_TYPE_STORAGE_IMAGE;
  local_70.descriptorCount = 1;
  local_70.pImageInfo = &local_30;
  (**(code **)(*in_RDI + 0x10))();
  this_01 = std::__shared_ptr_access<myvk::Device,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
            operator->((__shared_ptr_access<myvk::Device,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                        *)0x2e5ef7);
  pVVar2 = Device::GetHandle(this_01);
  (*p_Var1)(pVVar2,1,&local_70,0,(VkCopyDescriptorSet *)0x0);
  return;
}

Assistant:

void DescriptorSet::UpdateStorageImage(const Ptr<ImageView> &image_view, uint32_t binding,
                                       uint32_t array_element) const {
	VkDescriptorImageInfo info = {};
	info.imageView = image_view->GetHandle();
	info.imageLayout = VK_IMAGE_LAYOUT_GENERAL;

	VkWriteDescriptorSet write = {};
	write.sType = VK_STRUCTURE_TYPE_WRITE_DESCRIPTOR_SET;
	write.dstSet = m_descriptor_set;
	write.dstBinding = binding;
	write.dstArrayElement = array_element;
	write.descriptorType = VK_DESCRIPTOR_TYPE_STORAGE_IMAGE;
	write.descriptorCount = 1;
	write.pImageInfo = &info;

	vkUpdateDescriptorSets(GetDevicePtr()->GetHandle(), 1, &write, 0, nullptr);
}